

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::CopyTexImage2D::exec(CopyTexImage2D *this,Thread *t)

{
  code *pcVar1;
  deUint32 dVar2;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Texture *pTVar5;
  MessageBuilder local_990;
  MessageBuilder local_800;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  CopyTexImage2D *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [39])"Begin -- glBindTexture(GL_TEXTURE_2D, ");
  pTVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pTVar5->texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8);
    pTVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    (*pcVar1)(0xde1,pTVar5->texture);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x440);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4e0,(char (*) [42])"Begin -- glCopyTexImage2D(GL_TEXTURE_2D, ");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_level);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_internalFormat);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_x);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_y);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_width);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_height);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_border);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x350))
              (0xde1,this->m_level,this->m_internalFormat,this->m_x,this->m_y,this->m_width,
               this->m_height,this->m_border);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,
                    "copyTexImage2D(GL_TEXTURE_2D, m_level, m_internalFormat, m_x, m_y, m_width, m_height, m_border)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x444);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_670,(char (*) [26])"End -- glCopyTexImage2D()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
  tcu::ThreadUtil::Thread::newMessage(&local_800,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_800,(char (*) [41])"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_800);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar2 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x448);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_990,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_990,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_990);
  return;
}

Assistant:

void CopyTexImage2D::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glCopyTexImage2D(GL_TEXTURE_2D, " << m_level << ", " << m_internalFormat << ", " << m_x << ", " << m_y << ", " << m_width << ", " << m_height << ", " << m_border << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, copyTexImage2D(GL_TEXTURE_2D, m_level, m_internalFormat, m_x, m_y, m_width, m_height, m_border));
	thread.newMessage() << "End -- glCopyTexImage2D()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}